

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall duckdb::TableAppendState::~TableAppendState(TableAppendState *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ColumnAppendState_*,_false> __ptr;
  unsafe_unique_array<ColumnAppendState> *this_00;
  
  p_Var1 = (this->hashes).auxiliary.internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->hashes).buffer.internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->hashes).validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
           .
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  LogicalType::~LogicalType(&(this->hashes).type);
  _Var2._M_head_impl =
       (this->stats).table_sample.
       super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
       super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
       .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (BlockingSample *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_BlockingSample + 8))();
  }
  (this->stats).table_sample.
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = (BlockingSample *)0x0;
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
  ::~vector(&(this->stats).column_stats.
             super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
           );
  p_Var1 = (this->stats).stats_lock.internal.
           super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&this->append_lock);
  __ptr._M_head_impl =
       (this->row_group_append_state).states.
       super_unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
       .super__Head_base<0UL,_duckdb::ColumnAppendState_*,_false>._M_head_impl;
  this_00 = &(this->row_group_append_state).states;
  if (__ptr._M_head_impl != (ColumnAppendState *)0x0) {
    ::std::default_delete<duckdb::ColumnAppendState[]>::operator()
              ((default_delete<duckdb::ColumnAppendState[]> *)this_00,__ptr._M_head_impl);
  }
  (this_00->
  super_unique_ptr<duckdb::ColumnAppendState[],_std::default_delete<duckdb::ColumnAppendState[]>_>).
  _M_t.
  super___uniq_ptr_impl<duckdb::ColumnAppendState,_std::default_delete<duckdb::ColumnAppendState[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
       = (_Tuple_impl<0UL,_duckdb::ColumnAppendState_*,_std::default_delete<duckdb::ColumnAppendState[]>_>
          )0x0;
  return;
}

Assistant:

TableAppendState::~TableAppendState() {
}